

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_histogram.c
# Opt level: O2

REF_STATUS ref_histogram_ratio(REF_GRID ref_grid)

{
  uint uVar1;
  undefined8 uVar2;
  char *pcVar3;
  REF_HISTOGRAM ref_histogram;
  REF_HISTOGRAM local_20;
  
  uVar1 = ref_histogram_create(&local_20);
  if (uVar1 == 0) {
    uVar1 = ref_histogram_add_ratio(local_20,ref_grid);
    if (uVar1 == 0) {
      if ((ref_grid->mpi->id == 0) &&
         (ref_histogram_print(local_20,ref_grid,"edge ratio"), ref_grid->mpi->id == 0)) {
        ref_histogram_print_stat(local_20);
      }
      uVar1 = ref_histogram_free(local_20);
      if (uVar1 == 0) {
        return 0;
      }
      pcVar3 = "free gram";
      uVar2 = 0x1f7;
    }
    else {
      pcVar3 = "add ratio";
      uVar2 = 0x1f0;
    }
  }
  else {
    pcVar3 = "create";
    uVar2 = 0x1eb;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_histogram.c",uVar2
         ,"ref_histogram_ratio",(ulong)uVar1,pcVar3);
  return uVar1;
}

Assistant:

REF_FCN REF_STATUS ref_histogram_ratio(REF_GRID ref_grid) {
  REF_HISTOGRAM ref_histogram;

  RSS(ref_histogram_create(&ref_histogram), "create");

  if (REF_FALSE)
    RSS(ref_histogram_debug(ref_histogram, "ref_histogram.len"), "dbug");

  RSS(ref_histogram_add_ratio(ref_histogram, ref_grid), "add ratio");

  if (ref_grid_once(ref_grid))
    RSS(ref_histogram_print(ref_histogram, ref_grid, "edge ratio"), "print");
  if (ref_grid_once(ref_grid))
    RSS(ref_histogram_print_stat(ref_histogram), "pr stat");

  RSS(ref_histogram_free(ref_histogram), "free gram");
  return REF_SUCCESS;
}